

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCallIndirectExpr
          (ExprVisitorDelegate *this,CallIndirectExpr *expr)

{
  WatWriter *this_00;
  Index index;
  char *s;
  NextChar next_char;
  Var type_var;
  
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::CallIndirect_Opcode);
  WritePutsSpace(this_00,s);
  WriteVarUnlessZero(this->writer_,&expr->table,next_char);
  WriteOpenSpace(this->writer_,"type");
  if ((expr->decl).has_func_type == true) {
    Var::Var(&type_var,&(expr->decl).type_var);
  }
  else {
    index = Module::GetFuncTypeIndex((this->writer_->super_ModuleContext).module,&expr->decl);
    Var::Var(&type_var,index,&(expr->super_ExprMixin<(wabt::ExprType)13>).super_Expr.loc);
  }
  WriteVar(this->writer_,&type_var,Newline);
  WriteCloseNewline(this->writer_);
  Var::~Var(&type_var);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCallIndirectExpr(
    CallIndirectExpr* expr) {
  writer_->WritePutsSpace(Opcode::CallIndirect_Opcode.GetName());
  writer_->WriteVarUnlessZero(expr->table, NextChar::Space);
  writer_->WriteOpenSpace("type");
  const auto type_var =
      expr->decl.has_func_type
          ? expr->decl.type_var
          : Var{writer_->module.GetFuncTypeIndex(expr->decl), expr->loc};
  writer_->WriteVar(type_var, NextChar::Newline);
  writer_->WriteCloseNewline();
  return Result::Ok;
}